

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByPrintableName
          (DescriptorPool *this,Descriptor *extendee,string_view printable_name)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  Symbol SVar4;
  Descriptor *pDVar5;
  long lVar6;
  FieldDescriptor *this_00;
  long lVar7;
  
  if (extendee->extension_range_count_ != 0) {
    SVar4 = Tables::FindByNameHelper
                      ((this->tables_)._M_t.
                       super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                       .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                       _M_head_impl,this,printable_name);
    if ((((SVar4.ptr_)->symbol_type_ == '\x02') && ((SVar4.ptr_[1].symbol_type_ & 8) != 0)) &&
       (*(Descriptor **)(SVar4.ptr_ + 0x20) == extendee)) {
      return (FieldDescriptor *)SVar4.ptr_;
    }
    if ((((extendee->options_->field_0)._impl_.message_set_wire_format_ == true) &&
        (SVar4 = Tables::FindByNameHelper
                           ((this->tables_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl,this,printable_name), (SVar4.ptr_)->symbol_type_ == '\x01'
        )) && (iVar2 = *(int *)(SVar4.ptr_ + 0x94), 0 < (long)iVar2)) {
      lVar6 = 0x48;
      lVar7 = 0;
      do {
        if (*(int *)(SVar4.ptr_ + 0x94) <= lVar7) {
          FindExtensionByPrintableName();
LAB_0015712a:
          FindExtensionByPrintableName();
        }
        lVar3 = *(long *)(SVar4.ptr_ + 0x68);
        if (((*(Descriptor **)(lVar3 + -0x28 + lVar6) == extendee) &&
            (*(char *)(lVar3 + -0x46 + lVar6) == '\v')) &&
           (*(int *)(*(long *)(lVar3 + lVar6) + 0x30) != 3)) {
          bVar1 = *(byte *)(lVar3 + -0x47 + lVar6);
          if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) goto LAB_0015712a;
          if ((bVar1 & 0x20) == 0) {
            this_00 = (FieldDescriptor *)(lVar3 + lVar6 + -0x48);
            pDVar5 = FieldDescriptor::message_type(this_00);
            if (pDVar5 == (Descriptor *)SVar4.ptr_) {
              return this_00;
            }
          }
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x58;
      } while (iVar2 != lVar7);
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByPrintableName(
    const Descriptor* extendee, absl::string_view printable_name) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  const FieldDescriptor* result = FindExtensionByName(printable_name);
  if (result != nullptr && result->containing_type() == extendee) {
    return result;
  }
  if (extendee->options().message_set_wire_format()) {
    // MessageSet extensions may be identified by type name.
    const Descriptor* type = FindMessageTypeByName(printable_name);
    if (type != nullptr) {
      // Look for a matching extension in the foreign type's scope.
      const int type_extension_count = type->extension_count();
      for (int i = 0; i < type_extension_count; i++) {
        const FieldDescriptor* extension = type->extension(i);
        if (extension->containing_type() == extendee &&
            extension->type() == FieldDescriptor::TYPE_MESSAGE &&
            !extension->is_required() && !extension->is_repeated() &&
            extension->message_type() == type) {
          // Found it.
          return extension;
        }
      }
    }
  }
  return nullptr;
}